

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DefaultSecretGenerator::CreateDefaultEntryInternal
          (DefaultSecretGenerator *this,string *entry_name)

{
  bool bVar1;
  iterator __it;
  pointer pSVar2;
  pointer pSVar3;
  IOException *this_00;
  SerializationException *this_01;
  key_type *in_RDX;
  pointer *__ptr;
  undefined1 local_438 [8];
  undefined1 local_430 [8];
  LocalFileSystem fs;
  string secret_path;
  BufferedFileReader file_reader;
  string base_secret_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380 [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  BinaryDeserializer deserializer;
  
  __it = ::std::
         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(entry_name + 1),in_RDX);
  if (__it.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    (this->super_DefaultGenerator)._vptr_DefaultGenerator = (_func_int **)0x0;
  }
  else {
    fs.super_FileSystem._vptr_FileSystem = (FileSystem)&PTR__FileSystem_027953e8;
    (**(code **)(**(long **)((long)&entry_name->field_2 + 8) + 0x50))(&base_secret_path);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &deserializer,in_RDX,".duckdb_secret");
    FileSystem::JoinPath
              (&secret_path,&fs.super_FileSystem,&base_secret_path,(string *)&deserializer);
    ::std::__cxx11::string::~string((string *)&deserializer);
    BufferedFileReader::BufferedFileReader
              (&file_reader,&fs.super_FileSystem,secret_path._M_dataplus._M_p,READ_LOCK,
               (optional_ptr<duckdb::FileOpener,_true>)0x0);
    bVar1 = LocalFileSystem::IsPrivateFile(&secret_path,(FileOpener *)0x0);
    if (!bVar1) {
      this_00 = (IOException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&deserializer,
                 "The secret file \'%s\' has incorrect permissions! Please set correct permissions or remove file"
                 ,(allocator *)local_438);
      ::std::__cxx11::string::string((string *)&local_2e0,(string *)&secret_path);
      IOException::IOException<std::__cxx11::string>(this_00,(string *)&deserializer,&local_2e0);
      __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar1 = BufferedFileReader::Finished(&file_reader);
    if (bVar1) {
      BufferedFileReader::~BufferedFileReader(&file_reader);
      this_01 = (SerializationException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&deserializer,
                 "Failed to deserialize secret \'%s\' from \'%s\': file appears empty! Please remove the file, restart and try again"
                 ,(allocator *)&file_reader);
      ::std::__cxx11::string::string((string *)local_380,(string *)in_RDX);
      ::std::__cxx11::string::string((string *)&local_3a0,(string *)&secret_path);
      SerializationException::SerializationException<std::__cxx11::string,std::__cxx11::string>
                (this_01,(string *)&deserializer,local_380,&local_3a0);
      __cxa_throw(this_01,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
    }
    BinaryDeserializer::BinaryDeserializer(&deserializer,&file_reader.super_ReadStream);
    BinaryDeserializer::OnObjectBegin(&deserializer);
    SecretManager::DeserializeSecret
              ((SecretManager *)local_438,*(Deserializer **)((long)&entry_name->field_2 + 8),
               (string *)&deserializer);
    BinaryDeserializer::OnObjectEnd(&deserializer);
    make_uniq<duckdb::SecretCatalogEntry,duckdb::unique_ptr<duckdb::BaseSecret,std::default_delete<duckdb::BaseSecret>,true>,duckdb::Catalog&>
              ((duckdb *)local_430,
               (unique_ptr<duckdb::BaseSecret,_std::default_delete<duckdb::BaseSecret>,_true> *)
               local_438,(Catalog *)entry_name->_M_string_length);
    pSVar2 = unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
             ::operator->((unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
                           *)local_430);
    pSVar3 = unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>::
             operator->(&pSVar2->secret);
    ::std::__cxx11::string::assign((char *)&pSVar3->storage_mode);
    pSVar2 = unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
             ::operator->((unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
                           *)local_430);
    pSVar3 = unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>::
             operator->(&pSVar2->secret);
    pSVar3->persist_type = PERSISTENT;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::erase((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)(entry_name + 1),
            (const_iterator)
            __it.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur);
    (this->super_DefaultGenerator)._vptr_DefaultGenerator = (_func_int **)local_430;
    if (local_438 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_438 + 8))();
    }
    Deserializer::~Deserializer(&deserializer.super_Deserializer);
    BufferedFileReader::~BufferedFileReader(&file_reader);
    ::std::__cxx11::string::~string((string *)&secret_path);
    ::std::__cxx11::string::~string((string *)&base_secret_path);
    FileSystem::~FileSystem(&fs.super_FileSystem);
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> DefaultSecretGenerator::CreateDefaultEntryInternal(const string &entry_name) {
	auto secret_lu = persistent_secrets.find(entry_name);
	if (secret_lu == persistent_secrets.end()) {
		return nullptr;
	}

	LocalFileSystem fs;

	string base_secret_path = secret_manager.PersistentSecretPath();
	string secret_path = fs.JoinPath(base_secret_path, entry_name + ".duckdb_secret");

	// Note each file should contain 1 secret
	try {
		auto file_reader = BufferedFileReader(fs, secret_path.c_str());

		if (!LocalFileSystem::IsPrivateFile(secret_path, nullptr)) {
			throw IOException(
			    "The secret file '%s' has incorrect permissions! Please set correct permissions or remove file",
			    secret_path);
		}

		if (!file_reader.Finished()) {
			BinaryDeserializer deserializer(file_reader);

			deserializer.Begin();
			auto deserialized_secret = secret_manager.DeserializeSecret(deserializer, secret_path);
			deserializer.End();

			auto entry = make_uniq<SecretCatalogEntry>(std::move(deserialized_secret), catalog);
			entry->secret->storage_mode = SecretManager::LOCAL_FILE_STORAGE_NAME;
			entry->secret->persist_type = SecretPersistType::PERSISTENT;

			// Finally: we remove the default entry from the persistent_secrets, otherwise we aren't able to drop it
			// later
			persistent_secrets.erase(secret_lu);

			return std::move(entry);
		}
	} catch (std::exception &ex) {
		ErrorData error(ex);
		switch (error.Type()) {
		case ExceptionType::SERIALIZATION:
			throw SerializationException(
			    "Failed to deserialize the persistent secret file: '%s'. The file maybe be "
			    "corrupt, please remove the file, restart and try again. (error message: '%s')",
			    secret_path, error.RawMessage());
		case ExceptionType::IO:
			throw IOException(
			    "Failed to open the persistent secret file: '%s'. Some other process may have removed it, "
			    "please restart and try again. (error message: '%s')",
			    secret_path, error.RawMessage());
		default:
			throw;
		}
	}

	throw SerializationException("Failed to deserialize secret '%s' from '%s': file appears empty! Please remove the "
	                             "file, restart and try again",
	                             entry_name, secret_path);
}